

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

bool __thiscall Application::CanOpenDocument(Application *this,char *name)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Checking whether we can open document ",0x26);
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x105058);
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return true;
}

Assistant:

bool Application::CanOpenDocument(const char* name) {
    std::cout << "Checking whether we can open document " << name << "." << std::endl;
    return true;
}